

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O0

int __thiscall jrtplib::RTPSession::SetPreTransmissionDelay(RTPSession *this,RTPTime *delay)

{
  int status;
  RTPTime *delay_local;
  RTPSession *this_local;
  
  if ((this->created & 1U) == 0) {
    this_local._4_4_ = -0x3e;
  }
  else {
    this_local._4_4_ = RTCPPacketBuilder::SetPreTransmissionDelay(&this->rtcpbuilder,delay);
  }
  return this_local._4_4_;
}

Assistant:

int RTPSession::SetPreTransmissionDelay(const RTPTime &delay)
{
	if (!created)
		return ERR_RTP_SESSION_NOTCREATED;

	int status;

	BUILDER_LOCK
	status = rtcpbuilder.SetPreTransmissionDelay(delay);
	BUILDER_UNLOCK
	return status;
}